

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O0

void __thiscall Imf_3_3::TimeCode::setSeconds(TimeCode *this,int value)

{
  uint field;
  ArgExc *this_00;
  int in_ESI;
  uint *in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  if ((-1 < in_ESI) && (in_ESI < 0x3c)) {
    field = anon_unknown_1::binaryToBcd(in_ESI);
    anon_unknown_1::setBitField(in_RDI,8,0xe,field);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffffc8);
  __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
TimeCode::setSeconds (int value)
{
    if (value < 0 || value > 59)
        throw IEX_NAMESPACE::ArgExc ("Cannot set seconds field in time code. "
                                     "New value is out of range.");

    setBitField (_time, 8, 14, binaryToBcd (value));
}